

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

void MatchFinder_ReadBlock(CMatchFinder *p)

{
  ulong uVar1;
  UInt32 UVar2;
  SRes SVar3;
  uint uVar4;
  UInt32 UVar5;
  ulong uVar6;
  size_t size;
  Byte *local_18;
  
  if (p->streamEndWasReached != '\0') {
    return;
  }
  if (p->result == 0) {
    if (p->directInput == '\0') {
      UVar2 = p->pos;
      UVar5 = p->streamPos;
      do {
        local_18 = p->bufferBase + ((ulong)p->blockSize - (long)(p->buffer + (UVar5 - UVar2)));
        if (local_18 == (Byte *)0x0) {
          return;
        }
        SVar3 = (*p->stream->Read)(p->stream,p->buffer + (UVar5 - UVar2),(size_t *)&local_18);
        p->result = SVar3;
        if (SVar3 != 0) {
          return;
        }
        if (local_18 == (Byte *)0x0) goto LAB_0011415e;
        UVar5 = (int)local_18 + p->streamPos;
        p->streamPos = UVar5;
        UVar2 = p->pos;
      } while (UVar5 - UVar2 <= p->keepSizeAfter);
    }
    else {
      uVar4 = ~p->streamPos + p->pos;
      uVar1 = p->directInputRem;
      uVar6 = uVar1 & 0xffffffff;
      if (uVar4 <= uVar1) {
        uVar6 = (ulong)uVar4;
      }
      p->directInputRem = uVar1 - uVar6;
      p->streamPos = (int)uVar6 + p->streamPos;
      if (uVar1 - uVar6 == 0) {
LAB_0011415e:
        p->streamEndWasReached = '\x01';
      }
    }
  }
  return;
}

Assistant:

static void MatchFinder_ReadBlock(CMatchFinder *p)
{
  if (p->streamEndWasReached || p->result != SZ_OK)
    return;

  /* We use (p->streamPos - p->pos) value. (p->streamPos < p->pos) is allowed. */

  if (p->directInput)
  {
    UInt32 curSize = 0xFFFFFFFF - (p->streamPos - p->pos);
    if (curSize > p->directInputRem)
      curSize = (UInt32)p->directInputRem;
    p->directInputRem -= curSize;
    p->streamPos += curSize;
    if (p->directInputRem == 0)
      p->streamEndWasReached = 1;
    return;
  }
  
  for (;;)
  {
    Byte *dest = p->buffer + (p->streamPos - p->pos);
    size_t size = (p->bufferBase + p->blockSize - dest);
    if (size == 0)
      return;

    p->result = p->stream->Read(p->stream, dest, &size);
    if (p->result != SZ_OK)
      return;
    if (size == 0)
    {
      p->streamEndWasReached = 1;
      return;
    }
    p->streamPos += (UInt32)size;
    if (p->streamPos - p->pos > p->keepSizeAfter)
      return;
  }
}